

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::get(format_arg *__return_storage_ptr__,
     basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     *this,size_type index)

{
  longlong lVar1;
  size_t sVar2;
  undefined8 uVar3;
  format_arg arg;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_38;
  int local_28;
  undefined4 uStack_24;
  undefined8 uStack_20;
  
  do_get((format_arg *)&local_38.string,this,index);
  if (local_28 == 1) {
    lVar1 = *(longlong *)(local_38.long_long_value + 0x10);
    sVar2 = *(size_t *)(local_38.long_long_value + 0x18);
    uVar3 = *(undefined8 *)(local_38.long_long_value + 0x28);
    *(undefined8 *)&__return_storage_ptr__->type_ = *(undefined8 *)(local_38.long_long_value + 0x20)
    ;
    *(undefined8 *)&__return_storage_ptr__->field_0x18 = uVar3;
    (__return_storage_ptr__->value_).field_0.long_long_value = lVar1;
    (__return_storage_ptr__->value_).field_0.string.size = sVar2;
  }
  else {
    *(ulong *)&__return_storage_ptr__->type_ = CONCAT44(uStack_24,local_28);
    *(undefined8 *)&__return_storage_ptr__->field_0x18 = uStack_20;
    (__return_storage_ptr__->value_).field_0.long_long_value = local_38.long_long_value;
    (__return_storage_ptr__->value_).field_0.string.size = local_38.string.size;
  }
  return __return_storage_ptr__;
}

Assistant:

format_arg get(size_type index) const {
    format_arg arg = do_get(index);
    return arg.type_ == internal::named_arg_type ?
          arg.value_.as_named_arg().template deserialize<Context>() : arg;
  }